

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O2

void h265e_dpb_dec_refresh_marking(H265eDpb *dpb,RK_S32 poc_cur,NALUnitType nalUnitType)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_dec_refresh_marking");
  }
  if ((uint)(nalUnitType + ~(NAL_RASL_N|NAL_RADL_R)) < 5) {
    for (lVar3 = 0; lVar3 != 0x660; lVar3 = lVar3 + 0x60) {
      if ((*(int *)((long)&dpb->frame_list[0].inited + lVar3) != 0) &&
         (iVar1 = *(int *)((long)&dpb->frame_list[0].poc + lVar3), iVar1 != poc_cur)) {
        *(undefined4 *)(*(long *)((long)&dpb->frame_list[0].slice + lVar3) + 0x678) = 0;
        *(undefined4 *)((long)&dpb->frame_list[0].is_long_term + lVar3) = 0;
        if (iVar1 < poc_cur) {
          *(undefined4 *)((long)&dpb->frame_list[0].used_by_cur + lVar3) = 0;
          *(undefined1 *)((long)&dpb->frame_list[0].field_7 + lVar3) = 0;
          *(undefined8 *)((long)&dpb->frame_list[0].status + lVar3) = 0;
        }
      }
    }
    if (2 < (uint)(nalUnitType + ~(NAL_RASL_N|NAL_RADL_R))) goto LAB_001c11d7;
  }
  else {
    if ((dpb->refresh_pending == 1) && (iVar1 = dpb->poc_cra, iVar1 < poc_cur)) {
      for (lVar3 = 0; lVar3 != 0x660; lVar3 = lVar3 + 0x60) {
        if ((*(int *)((long)&dpb->frame_list[0].inited + lVar3) != 0) &&
           (iVar2 = *(int *)((long)&dpb->frame_list[0].poc + lVar3),
           iVar2 != iVar1 && iVar2 != poc_cur)) {
          *(undefined4 *)(*(long *)((long)&dpb->frame_list[0].slice + lVar3) + 0x678) = 0;
          *(undefined1 *)((long)&dpb->frame_list[0].field_7 + lVar3) = 0;
        }
      }
      dpb->refresh_pending = 0;
    }
    if (nalUnitType != NAL_CRA_NUT) goto LAB_001c11d7;
    dpb->refresh_pending = 1;
  }
  dpb->poc_cra = poc_cur;
LAB_001c11d7:
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_dec_refresh_marking");
    return;
  }
  return;
}

Assistant:

void h265e_dpb_dec_refresh_marking(H265eDpb *dpb, RK_S32 poc_cur, enum NALUnitType nalUnitType)
{
    RK_U32 index = 0;

    h265e_dbg_func("enter\n");

    if (nalUnitType == NAL_BLA_W_LP
        || nalUnitType == NAL_BLA_W_RADL
        || nalUnitType == NAL_BLA_N_LP
        || nalUnitType == NAL_IDR_W_RADL
        || nalUnitType == NAL_IDR_N_LP) { // IDR or BLA picture
        // mark all pictures as not used for reference
        H265eDpbFrm *frame_List = &dpb->frame_list[0];
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &frame_List[index];
            if (frame->inited && (frame->poc != poc_cur)) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                if (frame->poc < poc_cur) {
                    frame->used_by_cur = 0;
                    frame->dpb_used = 0;
                    frame->status.val = 0;
                }
            }
        }

        if (nalUnitType == NAL_BLA_W_LP
            || nalUnitType == NAL_BLA_W_RADL
            || nalUnitType == NAL_BLA_N_LP) {
            dpb->poc_cra = poc_cur;
        }
    } else { // CRA or No DR
        if (dpb->refresh_pending == 1 && poc_cur > dpb->poc_cra) { // CRA reference marking pending
            H265eDpbFrm *frame_list = &dpb->frame_list[0];
            for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {

                H265eDpbFrm *frame = &frame_list[index];
                if (frame->inited && frame->poc != poc_cur && frame->poc != dpb->poc_cra) {
                    frame->slice->is_referenced = 0;
                    frame->dpb_used = 0;
                }
            }

            dpb->refresh_pending = 0;
        }
        if (nalUnitType == NAL_CRA_NUT) { // CRA picture found
            dpb->refresh_pending = 1;
            dpb->poc_cra = poc_cur;
        }
    }
    h265e_dbg_func("leave\n");
}